

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void saveImage(char *filepath,GLFWwindow *w)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int height;
  int width;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_39;
  int local_38;
  int local_34;
  vector<char,_std::allocator<char>_> local_30;
  
  glfwGetFramebufferSize(w,&local_34,&local_38);
  uVar1 = (uint)((long)local_34 * 3);
  uVar2 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  iVar4 = uVar1 - (uVar2 & 0xfffffffc);
  iVar3 = 4 - iVar4;
  if (iVar4 == 0) {
    iVar3 = 0;
  }
  lVar5 = (long)iVar3 + (long)local_34 * 3;
  std::vector<char,_std::allocator<char>_>::vector(&local_30,local_38 * lVar5,&local_39);
  (*glad_glPixelStorei)(0xd05,4);
  (*glad_glReadBuffer)(0x404);
  (*glad_glReadPixels)
            (0,0,local_34,local_38,0x1907,0x1401,
             local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  stbi__flip_vertically_on_write = 1;
  stbi_write_png(filepath,local_34,local_38,3,
                 local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,(int)lVar5);
  if (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void saveImage(const char filepath[], GLFWwindow* w) {
	int width, height;
	glfwGetFramebufferSize(w, &width, &height);
	GLsizei nrChannels = 3;
	GLsizei stride = nrChannels * width;
	stride += (stride % 4) ? (4 - stride % 4) : 0;
	GLsizei bufferSize = stride * height;
	std::vector<char> buffer(bufferSize);
	glPixelStorei(GL_PACK_ALIGNMENT, 4);
	glReadBuffer(GL_FRONT);
	glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, buffer.data());
	stbi_flip_vertically_on_write(true);
	stbi_write_png(filepath, width, height, nrChannels, buffer.data(), stride);
}